

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptProxy::GetPropertyReferenceQuery
          (JavascriptProxy *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  anon_class_32_4_051f6e2a fn_00;
  Var instance;
  bool bVar1;
  PropertyQueryFlags PVar2;
  RecyclableObject *pRVar3;
  PropertyDescriptor local_f0;
  Type local_c0;
  Type TStack_bf;
  undefined6 uStack_be;
  undefined1 *local_b8;
  Var *local_b0;
  PropertyId *local_a8;
  Var **local_a0;
  BOOL local_94;
  undefined1 local_90 [4];
  BOOL foundProperty;
  PropertyDescriptor result;
  anon_class_8_1_66460f8e getPropertyId;
  anon_class_32_4_051f6e2a fn;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  Var pvStack_18;
  PropertyId propertyId_local;
  Var originalInstance_local;
  JavascriptProxy *this_local;
  
  fn.requestContext = (ScriptContext **)requestContext;
  info_local = (PropertyValueInfo *)value;
  value_local._4_4_ = propertyId;
  pvStack_18 = originalInstance;
  originalInstance_local = this;
  PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
  PropertyValueInfo::DisablePrototypeCache(info,(RecyclableObject *)this);
  fn.originalInstance = (Var *)((long)&value_local + 4);
  fn.propertyId = (PropertyId *)&info_local;
  fn.value = &fn.requestContext;
  result._40_8_ = (long)&value_local + 4;
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_90);
  local_b0 = fn.originalInstance;
  local_a8 = fn.propertyId;
  local_a0 = fn.value;
  local_c0 = result.Configurable;
  TStack_bf = result.fromProxy;
  uStack_be = result._42_6_;
  fn_00.propertyId = (PropertyId *)fn.originalInstance;
  fn_00.originalInstance = &stack0xffffffffffffffe8;
  fn_00.value = (Var **)fn.propertyId;
  fn_00.requestContext = (ScriptContext **)fn.value;
  local_b8 = (undefined1 *)&stack0xffffffffffffffe8;
  local_94 = GetPropertyTrap<Js::JavascriptProxy::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__0,Js::JavascriptProxy::GetPropertyReferenceQuery(void*,int,void**,Js::PropertyValueInfo*,Js::ScriptContext*)::__1>
                       (this,pvStack_18,(PropertyDescriptor *)local_90,fn_00,
                        (anon_class_8_1_66460f8e)result._40_8_,(ScriptContext *)fn.requestContext);
  if (local_94 == 0) {
    pRVar3 = ScriptContext::GetMissingPropertyResult((ScriptContext *)fn.requestContext);
    info_local->m_instance = pRVar3;
  }
  else {
    bVar1 = PropertyDescriptor::IsFromProxy((PropertyDescriptor *)local_90);
    instance = pvStack_18;
    if (bVar1) {
      PropertyDescriptor::PropertyDescriptor(&local_f0,(PropertyDescriptor *)local_90);
      pRVar3 = (RecyclableObject *)
               GetValueFromDescriptor(this,instance,&local_f0,(ScriptContext *)fn.requestContext);
      info_local->m_instance = pRVar3;
    }
  }
  PVar2 = JavascriptConversion::BooleanToPropertyQueryFlags(local_94);
  return PVar2;
}

Assistant:

PropertyQueryFlags JavascriptProxy::GetPropertyReferenceQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // We can't cache the property at this time. both target and handler can be changed outside of the proxy, so the inline cache needs to be
        // invalidate when target, handler, or handler prototype has changed. We don't have a way to achieve this yet.
        PropertyValueInfo::SetNoCache(info, this);
        PropertyValueInfo::DisablePrototypeCache(info, this); // We can't cache prototype property either
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::GetPropertyReference(originalInstance, object, propertyId, value, requestContext, nullptr);
        };
        auto getPropertyId = [&]() -> PropertyId {return propertyId; };
        PropertyDescriptor result;
        BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyId, requestContext);
        if (!foundProperty)
        {
            *value = requestContext->GetMissingPropertyResult();
        }
        else if (result.IsFromProxy())
        {
            *value = GetValueFromDescriptor(originalInstance, result, requestContext);
        }
        return JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
    }